

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O1

string * __thiscall
PvrLegacyInfo::PrintFlagNames_abi_cxx11_
          (string *__return_storage_ptr__,PvrLegacyInfo *this,uint flags)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar3 = (uint)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((uVar3 >> 8 & 1) != 0) {
    lVar2 = 0x143250;
    if (flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143250;
      lVar1 = flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 0x100;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143250;
    if ((lVar2 != 0x143250) && (lVar1 = 0x143250, *(uint *)(lVar2 + 0x20) < 0x101)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar3 >> 10 & 1) != 0) {
    lVar2 = 0x143250;
    if (flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143250;
      lVar1 = flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 0x400;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143250;
    if ((lVar2 != 0x143250) && (lVar1 = 0x143250, *(uint *)(lVar2 + 0x20) < 0x401)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar3 >> 0xc & 1) != 0) {
    lVar2 = 0x143250;
    if (flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143250;
      lVar1 = flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 0x1000;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143250;
    if ((lVar2 != 0x143250) && (lVar1 = 0x143250, *(uint *)(lVar2 + 0x20) < 0x1001)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar3 >> 0xe & 1) != 0) {
    lVar2 = 0x143250;
    if (flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143250;
      lVar1 = flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 0x4000;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143250;
    if ((lVar2 != 0x143250) && (lVar1 = 0x143250, *(uint *)(lVar2 + 0x20) < 0x4001)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((short)this < 0) {
    lVar2 = 0x143250;
    if (flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143250;
      lVar1 = flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 0x8000;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143250;
    if ((lVar2 != 0x143250) && (lVar1 = 0x143250, *(uint *)(lVar2 + 0x20) < 0x8001)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar3 >> 0x10 & 1) != 0) {
    lVar2 = 0x143250;
    if (flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143250;
      lVar1 = flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 0x10000;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143250;
    if ((lVar2 != 0x143250) && (lVar1 = 0x143250, *(uint *)(lVar2 + 0x20) < 0x10001)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  RemoveTrailingCharacter(__return_storage_ptr__,'|');
  return __return_storage_ptr__;
}

Assistant:

std::string PrintFlagNames(unsigned int flags) {
    std::string output;
    #define X(a,b) ENUM_APPEND_TO_STRING(a,flag_names)
    #include "defs/pvrLegacy/flags.def"
    #undef X
    RemoveTrailingCharacter(output,'|');
    return output;
  }